

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

QDataStream * operator<<(QDataStream *out,QUrl *url)

{
  Data *pDVar1;
  qsizetype qVar2;
  Data *data;
  char *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QByteArray local_58;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char *)0x0;
  local_38.d.size = 0;
  bVar4 = QUrl::isValid(url);
  if (bVar4) {
    QUrl::toEncoded(&local_58,url,(FormattingOptions)0x1f00000);
    pcVar3 = local_38.d.ptr;
    data = local_38.d.d;
    qVar2 = local_58.d.size;
    pDVar1 = local_58.d.d;
    local_58.d.d = local_38.d.d;
    local_38.d.d = pDVar1;
    local_38.d.ptr = local_58.d.ptr;
    local_58.d.ptr = pcVar3;
    local_58.d.size = local_38.d.size;
    local_38.d.size = qVar2;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,1,0x10);
      }
    }
  }
  operator<<(out,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return out;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QUrl &url)
{
    QByteArray u;
    if (url.isValid())
        u = url.toEncoded();
    out << u;
    return out;
}